

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie.cpp
# Opt level: O1

UNewTrie *
utrie_clone_63(UNewTrie *fillIn,UNewTrie *other,uint32_t *aliasData,int32_t aliasDataCapacity)

{
  UNewTrie *__dest;
  UBool UVar1;
  
  if (((other == (UNewTrie *)0x0) || (other->data == (uint32_t *)0x0)) ||
     (other->isCompacted != '\0')) {
LAB_002f5166:
    __dest = (UNewTrie *)0x0;
  }
  else {
    if ((aliasData == (uint32_t *)0x0) || (aliasDataCapacity < other->dataCapacity)) {
      aliasDataCapacity = other->dataCapacity;
      aliasData = (uint32_t *)uprv_malloc_63((long)aliasDataCapacity * 4);
      if (aliasData == (uint32_t *)0x0) goto LAB_002f5166;
      UVar1 = '\x01';
    }
    else {
      UVar1 = '\0';
    }
    __dest = utrie_open_63(fillIn,aliasData,aliasDataCapacity,*other->data,other->leadUnitValue,
                           other->isLatin1Linear);
    if (__dest == (UNewTrie *)0x0) {
      uprv_free_63(aliasData);
    }
    else {
      memcpy(__dest,other,0x22080);
      memcpy(__dest->data,other->data,(long)other->dataLength << 2);
      __dest->dataLength = other->dataLength;
      __dest->isDataAllocated = UVar1;
    }
  }
  return __dest;
}

Assistant:

U_CAPI UNewTrie * U_EXPORT2
utrie_clone(UNewTrie *fillIn, const UNewTrie *other, uint32_t *aliasData, int32_t aliasDataCapacity) {
    UNewTrie *trie;
    UBool isDataAllocated;

    /* do not clone if other is not valid or already compacted */
    if(other==NULL || other->data==NULL || other->isCompacted) {
        return NULL;
    }

    /* clone data */
    if(aliasData!=NULL && aliasDataCapacity>=other->dataCapacity) {
        isDataAllocated=FALSE;
    } else {
        aliasDataCapacity=other->dataCapacity;
        aliasData=(uint32_t *)uprv_malloc(other->dataCapacity*4);
        if(aliasData==NULL) {
            return NULL;
        }
        isDataAllocated=TRUE;
    }

    trie=utrie_open(fillIn, aliasData, aliasDataCapacity,
                    other->data[0], other->leadUnitValue,
                    other->isLatin1Linear);
    if(trie==NULL) {
        uprv_free(aliasData);
    } else {
        uprv_memcpy(trie->index, other->index, sizeof(trie->index));
        uprv_memcpy(trie->data, other->data, (size_t)other->dataLength*4);
        trie->dataLength=other->dataLength;
        trie->isDataAllocated=isDataAllocated;
    }

    return trie;
}